

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

xmlCharEncError UTF8ToLatin1(void *vctxt,uchar *out,int *outlen,uchar *in,int *inlen,int flush)

{
  byte *pbVar1;
  int iVar2;
  xmlCharEncError xVar3;
  byte *pbVar4;
  int iVar5;
  byte bVar6;
  long lVar7;
  byte *pbVar8;
  xmlCharEncError xVar9;
  
  iVar5 = (int)in;
  xVar3 = XML_ENC_ERR_INTERNAL;
  if (inlen != (int *)0x0 && (outlen != (int *)0x0 && out != (uchar *)0x0)) {
    if (in != (uchar *)0x0) {
      pbVar8 = out;
      if (0 < (long)*inlen) {
        pbVar4 = in + *inlen;
        iVar2 = *outlen;
        lVar7 = 0;
        do {
          pbVar8 = out + lVar7;
          if (out + iVar2 <= pbVar8) {
            xVar3 = XML_ENC_ERR_SPACE;
LAB_0012a6c2:
            xVar9 = (xmlCharEncError)lVar7;
            goto LAB_0012a6c5;
          }
          bVar6 = *in;
          if ((char)bVar6 < '\0') {
            if ((bVar6 & 0xfe) != 0xc2) {
              xVar3 = XML_ENC_ERR_INPUT;
              goto LAB_0012a6c2;
            }
            if ((long)pbVar4 - (long)in < 2) goto LAB_0012a6a6;
            pbVar1 = in + 1;
            in = in + 1;
            bVar6 = bVar6 << 6 | *pbVar1 & 0x3f;
          }
          *pbVar8 = bVar6;
          in = in + 1;
          lVar7 = lVar7 + 1;
        } while (in < pbVar4);
        pbVar8 = out + lVar7;
      }
LAB_0012a6a6:
      xVar9 = (int)pbVar8 - (int)out;
      xVar3 = xVar9;
LAB_0012a6c5:
      *outlen = xVar9;
      *inlen = (int)in - iVar5;
      return xVar3;
    }
    xVar3 = XML_ENC_ERR_SUCCESS;
    *inlen = 0;
    *outlen = 0;
  }
  return xVar3;
}

Assistant:

static xmlCharEncError
UTF8ToLatin1(void *vctxt ATTRIBUTE_UNUSED,
             unsigned char* out, int *outlen,
             const unsigned char* in, int *inlen,
             int flush ATTRIBUTE_UNUSED) {
    const unsigned char* outend;
    const unsigned char* outstart = out;
    const unsigned char* instart = in;
    const unsigned char* inend;
    unsigned c;
    int ret = XML_ENC_ERR_SPACE;

    if ((out == NULL) || (outlen == NULL) || (inlen == NULL))
        return(XML_ENC_ERR_INTERNAL);

    if (in == NULL) {
        *inlen = 0;
        *outlen = 0;
        return(XML_ENC_ERR_SUCCESS);
    }

    inend = in + *inlen;
    outend = out + *outlen;
    while (in < inend) {
        if (out >= outend)
            goto done;

	c = *in;

        if (c < 0x80) {
            *out++ = c;
        } else if ((c >= 0xC2) && (c <= 0xC3)) {
            if (inend - in < 2)
                break;
            in++;
            *out++ = (unsigned char) ((c << 6) | (*in & 0x3F));
        } else {
            ret = XML_ENC_ERR_INPUT;
            goto done;
	}

        in++;
    }

    ret = out - outstart;

done:
    *outlen = out - outstart;
    *inlen = in - instart;
    return(ret);
}